

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O2

bool __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,weighted_vec_array *weighted_vecs,
          uint max_clusters,vector<crnlib::vector<unsigned_int>_> *cluster_indices,
          progress_callback_func pProgress_callback,void *pProgress_callback_data)

{
  vector_clusterizer *this_00;
  bool bVar1;
  uint i;
  crn_thread_id_t cVar2;
  ulong uVar3;
  long lVar4;
  uint i_2;
  uint i_1;
  void *pData_ptr;
  uint uVar5;
  vector<unsigned_int> *left_indices;
  uint i_3;
  long lVar6;
  vector<unsigned_int> primary_indices;
  create_clusters_task_state task_state [4];
  vector<unsigned_int> indices [6];
  
  cVar2 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar2;
  this->m_canceled = false;
  this->m_pProgress_callback = pProgress_callback;
  this->m_pProgress_callback_data = pProgress_callback_data;
  if (max_clusters < 0x80) {
    this_00 = this->m_clusterizers;
    clusterizer<crnlib::vec<16U,_float>_>::clear(this_00);
    vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::reserve
              (&this_00->m_training_vecs,weighted_vecs->m_size);
    lVar4 = 0;
    for (uVar3 = 0; uVar3 < weighted_vecs->m_size; uVar3 = uVar3 + 1) {
      clusterizer<crnlib::vec<16U,_float>_>::add_training_vec
                (this_00,(vec<16U,_float> *)((long)(weighted_vecs->m_p->m_vec).m_s + lVar4),
                 *(uint *)((long)(&weighted_vecs->m_p->m_vec + 1) + lVar4));
      lVar4 = lVar4 + 0x44;
    }
    clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
              (this_00,max_clusters,generate_codebook_progress_callback,this,false);
    clusterizer<crnlib::vec<16U,_float>_>::retrieve_clusters
              (this_00,this->m_clusterizers[0].m_codebook.m_size,cluster_indices);
  }
  else {
    vector<unsigned_int>::vector(&primary_indices,weighted_vecs->m_size);
    for (uVar3 = 0; uVar3 < weighted_vecs->m_size; uVar3 = uVar3 + 1) {
      primary_indices.m_p[uVar3] = (uint)uVar3;
    }
    indices[5].m_p = (uint *)0x0;
    indices[5].m_size = 0;
    indices[5].m_capacity = 0;
    indices[4].m_p = (uint *)0x0;
    indices[4].m_size = 0;
    indices[4].m_capacity = 0;
    indices[3].m_p = (uint *)0x0;
    indices[3].m_size = 0;
    indices[3].m_capacity = 0;
    indices[2].m_p = (uint *)0x0;
    indices[2].m_size = 0;
    indices[2].m_capacity = 0;
    indices[1].m_p = (uint *)0x0;
    indices[1].m_size = 0;
    indices[1].m_capacity = 0;
    indices[0].m_p = (uint *)0x0;
    indices[0].m_size = 0;
    indices[0].m_capacity = 0;
    compute_split(this,weighted_vecs,&primary_indices,indices,indices + 1);
    left_indices = indices + 2;
    compute_split(this,weighted_vecs,indices,left_indices,indices + 3);
    compute_split(this,weighted_vecs,indices + 1,indices + 4,indices + 5);
    task_state[0].m_max_clusters = 0;
    task_state[0].m_cluster_indices.m_p = (vector<unsigned_int> *)0x0;
    task_state[0].m_cluster_indices.m_size = 0;
    task_state[0].m_cluster_indices.m_capacity = 0;
    task_state[0].m_pWeighted_vecs = (weighted_vec_array *)0x0;
    task_state[0].m_pIndices = (vector<unsigned_int> *)0x0;
    task_state[1].m_pWeighted_vecs = (weighted_vec_array *)0x0;
    task_state[1].m_pIndices = (vector<unsigned_int> *)0x0;
    task_state[1].m_cluster_indices.m_p = (vector<unsigned_int> *)0x0;
    task_state[1].m_cluster_indices.m_size = 0;
    task_state[1].m_cluster_indices.m_capacity = 0;
    task_state[1].m_max_clusters = 0;
    task_state[2].m_pWeighted_vecs = (weighted_vec_array *)0x0;
    task_state[2].m_pIndices = (vector<unsigned_int> *)0x0;
    task_state[2].m_cluster_indices.m_p = (vector<unsigned_int> *)0x0;
    task_state[2].m_cluster_indices.m_size = 0;
    task_state[2].m_cluster_indices.m_capacity = 0;
    task_state[2].m_max_clusters = 0;
    task_state[3].m_pWeighted_vecs = (weighted_vec_array *)0x0;
    task_state[3].m_pIndices = (vector<unsigned_int> *)0x0;
    task_state[3].m_max_clusters = 0;
    task_state[3].m_cluster_indices.m_p = (vector<unsigned_int> *)0x0;
    task_state[3].m_cluster_indices.m_size = 0;
    task_state[3].m_cluster_indices.m_capacity = 0;
    this->m_cluster_task_displayed_progress = false;
    uVar3 = 0;
    for (lVar4 = 0x28; lVar4 != 0x68; lVar4 = lVar4 + 0x10) {
      uVar3 = (ulong)(((int)uVar3 + 1) - (uint)(*(int *)((long)&indices[0].m_p + lVar4) == 0));
    }
    lVar4 = 0;
    for (pData_ptr = (void *)0x0; pData_ptr != (void *)0x4;
        pData_ptr = (void *)((long)pData_ptr + 1)) {
      if (left_indices->m_size != 0) {
        *(weighted_vec_array **)((long)&task_state[0].m_pWeighted_vecs + lVar4) = weighted_vecs;
        *(vector<unsigned_int> **)((long)&task_state[0].m_pIndices + lVar4) = left_indices;
        *(int *)((long)&task_state[0].m_max_clusters + lVar4) =
             (int)(((int)(uVar3 >> 1) + max_clusters) / uVar3);
        task_pool::
        queue_object_task<crnlib::threaded_clusterizer<crnlib::vec<16u,float>>,void(crnlib::threaded_clusterizer<crnlib::vec<16u,float>>::*)(unsigned_long_long,void*)>
                  (this->m_pTask_pool,this,0x12e4a0,0,pData_ptr);
      }
      left_indices = left_indices + 1;
      lVar4 = lVar4 + 0x28;
    }
    task_pool::join(this->m_pTask_pool);
    bVar1 = this->m_canceled;
    if (bVar1 == false) {
      uVar5 = 0;
      for (lVar4 = 0x18; lVar4 != 0xb8; lVar4 = lVar4 + 0x28) {
        uVar5 = uVar5 + *(int *)((long)&task_state[0].m_pWeighted_vecs + lVar4);
      }
      vector<crnlib::vector<unsigned_int>_>::reserve(cluster_indices,uVar5);
      vector<crnlib::vector<unsigned_int>_>::resize(cluster_indices,0,false);
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        uVar5 = cluster_indices->m_size;
        vector<crnlib::vector<unsigned_int>_>::resize
                  (cluster_indices,task_state[lVar4].m_cluster_indices.m_size + uVar5,false);
        lVar6 = 0;
        for (uVar3 = 0; uVar3 < task_state[lVar4].m_cluster_indices.m_size; uVar3 = uVar3 + 1) {
          vector<unsigned_int>::swap
                    (cluster_indices->m_p + (uVar5 + (int)uVar3),
                     (vector<unsigned_int> *)
                     ((long)&(task_state[lVar4].m_cluster_indices.m_p)->m_p + lVar6));
          lVar6 = lVar6 + 0x10;
        }
      }
    }
    lVar4 = 0x88;
    do {
      vector<crnlib::vector<unsigned_int>_>::~vector
                ((vector<crnlib::vector<unsigned_int>_> *)
                 ((long)&task_state[0].m_pWeighted_vecs + lVar4));
      lVar4 = lVar4 + -0x28;
    } while (lVar4 != -0x18);
    lVar4 = 0x50;
    do {
      vector<unsigned_int>::~vector((vector<unsigned_int> *)((long)&indices[0].m_p + lVar4));
      lVar4 = lVar4 + -0x10;
    } while (lVar4 != -0x10);
    vector<unsigned_int>::~vector(&primary_indices);
    if (bVar1 != false) {
      return false;
    }
  }
  return (bool)(this->m_canceled ^ 1);
}

Assistant:

bool create_clusters(
            const weighted_vec_array& weighted_vecs,
            uint max_clusters, crnlib::vector<crnlib::vector<uint> >& cluster_indices,
            progress_callback_func pProgress_callback,
            void* pProgress_callback_data)
        {
            m_main_thread_id = crn_get_current_thread_id();
            m_canceled = false;
            m_pProgress_callback = pProgress_callback;
            m_pProgress_callback_data = pProgress_callback_data;

            if (max_clusters >= 128)
            {
                crnlib::vector<uint> primary_indices(weighted_vecs.size());
                for (uint i = 0; i < weighted_vecs.size(); i++)
                {
                    primary_indices[i] = i;
                }

                CRNLIB_ASSUME(cMaxClusterizers == 4);

                crnlib::vector<uint> indices[6];

                compute_split(weighted_vecs, primary_indices, indices[0], indices[1]);
                compute_split(weighted_vecs, indices[0], indices[2], indices[3]);
                compute_split(weighted_vecs, indices[1], indices[4], indices[5]);

                create_clusters_task_state task_state[4];

                m_cluster_task_displayed_progress = false;

                uint total_partitions = 0;
                for (uint i = 0; i < 4; i++)
                {
                    const uint num_indices = indices[2 + i].size();
                    if (num_indices)
                    {
                        total_partitions++;
                    }
                }

                for (uint i = 0; i < 4; i++)
                {
                    const uint num_indices = indices[2 + i].size();
                    if (!num_indices)
                    {
                        continue;
                    }

                    task_state[i].m_pWeighted_vecs = &weighted_vecs;
                    task_state[i].m_pIndices = &indices[2 + i];
                    task_state[i].m_max_clusters = (max_clusters + (total_partitions / 2)) / total_partitions;

                    m_pTask_pool->queue_object_task(this, &threaded_clusterizer::create_clusters_task, i, &task_state[i]);
                }

                m_pTask_pool->join();

                if (m_canceled)
                {
                    return false;
                }

                uint total_clusters = 0;
                for (uint i = 0; i < 4; i++)
                {
                    total_clusters += task_state[i].m_cluster_indices.size();
                }

                cluster_indices.reserve(total_clusters);
                cluster_indices.resize(0);

                for (uint i = 0; i < 4; i++)
                {
                    const uint ofs = cluster_indices.size();

                    cluster_indices.resize(ofs + task_state[i].m_cluster_indices.size());

                    for (uint j = 0; j < task_state[i].m_cluster_indices.size(); j++)
                    {
                        cluster_indices[ofs + j].swap(task_state[i].m_cluster_indices[j]);
                    }
                }
            }
            else
            {
                m_clusterizers[0].clear();
                m_clusterizers[0].get_training_vecs().reserve(weighted_vecs.size());

                for (uint i = 0; i < weighted_vecs.size(); i++)
                {
                    const weighted_vec& v = weighted_vecs[i];

                    m_clusterizers[0].add_training_vec(v.m_vec, v.m_weight);
                }

                m_clusterizers[0].generate_codebook(max_clusters, generate_codebook_progress_callback, this, false);  //m_params.m_dxt_quality <= cCRNDXTQualityFast);

                const uint num_clusters = m_clusterizers[0].get_codebook_size();

                m_clusterizers[0].retrieve_clusters(num_clusters, cluster_indices);
            }

            return !m_canceled;
        }